

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O1

double __thiscall agg::bspline::interpolation(bspline *this,double x,int i)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar6 = this->m_x[i];
  dVar4 = this->m_x[(long)i + 1];
  dVar5 = dVar6 - dVar4;
  dVar6 = dVar6 - x;
  dVar4 = x - dVar4;
  dVar7 = (dVar5 * dVar5) / 6.0;
  pdVar3 = (this->m_am).m_array;
  dVar1 = pdVar3[i + 1];
  dVar2 = pdVar3[(uint)i];
  return (dVar4 * (this->m_y[i] - dVar7 * dVar2) + (this->m_y[(long)i + 1] - dVar1 * dVar7) * dVar6)
         / dVar5 + ((dVar6 * dVar1 * dVar6 * dVar6 + dVar4 * dVar2 * dVar4 * dVar4) / 6.0) / dVar5;
}

Assistant:

double bspline::interpolation(double x, int i) const
    {
        int j = i + 1;
        double d = m_x[i] - m_x[j];
        double h = x - m_x[j];
        double r = m_x[i] - x;
        double p = d * d / 6.0;
        return (m_am[j] * r * r * r + m_am[i] * h * h * h) / 6.0 / d +
               ((m_y[j] - m_am[j] * p) * r + (m_y[i] - m_am[i] * p) * h) / d;
    }